

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O1

bool show_version(CHAR_DATA *ch,char *argument)

{
  send_to_char("ILAB Online Creation [Beta 1.0, ROM 2.3 modified]\n\r     Port a ROM 2.4 v1.00\n\r",
               ch);
  send_to_char("\n\r",ch);
  send_to_char("     By Jason(jdinkel@mines.colorado.edu)\n\r     Modified for use with ROM 2.3\n\r     By Hans Birkeland (hansbi@ifi.uio.no)\n\r     Modified for use with Riftshadow\n\r     By Chad Sorrell (gabe@qhcf.net)\n\r"
               ,ch);
  send_to_char("\n\r",ch);
  send_to_char("     (Apr. 7, 1995 - ROM mod, Apr 16, 1995)\n\r     (Port a ROM 2.4 - Nov 2, 1996)\n\r     (Riftshadow Mod - June 1, 2001)\n\r"
               ,ch);
  send_to_char("\n\r",ch);
  send_to_char("     Original by Surreality(cxw197@psu.edu) and Locke(locke@lm.com)",ch);
  send_to_char("\n\r",ch);
  return false;
}

Assistant:

bool show_version(CHAR_DATA *ch, char *argument)
{
	send_to_char(SHOW_VERSION, ch);
	send_to_char("\n\r", ch);
	send_to_char(SHOW_AUTHOR, ch);
	send_to_char("\n\r", ch);
	send_to_char(SHOW_DATE, ch);
	send_to_char("\n\r", ch);
	send_to_char(SHOW_CREDITS, ch);
	send_to_char("\n\r", ch);

	return false;
}